

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesWidget.cxx
# Opt level: O1

void __thiscall cmCursesWidget::Move(cmCursesWidget *this,int x,int y,bool isNewPage)

{
  if (this->Field != (FIELD *)0x0) {
    move_field(this->Field,y,x);
    set_new_page(this->Field,isNewPage);
    return;
  }
  return;
}

Assistant:

void cmCursesWidget::Move(int x, int y, bool isNewPage)
{
  if (!this->Field) {
    return;
  }

  move_field(this->Field, y, x);
  if (isNewPage) {
    set_new_page(this->Field, true);
  } else {
    set_new_page(this->Field, false);
  }
}